

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

void iq3xs_init_impl(int grid_size)

{
  ushort uVar1;
  int i;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  int *piVar5;
  int *__ptr;
  char *pcVar6;
  ulong uVar7;
  int j;
  uint uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  int k;
  ulong uVar12;
  int i_1;
  int iVar13;
  int iVar14;
  uint32_t *puVar15;
  int iVar16;
  uint32_t *puVar17;
  int i_2;
  int iVar18;
  uint16_t *puVar19;
  int8_t pos [4];
  uint32_t aux32;
  uint32_t *local_48;
  size_t local_40;
  uint16_t *local_38;
  
  uVar2 = iq3_data_index(grid_size);
  if (iq3_data[uVar2].grid == (uint32_t *)0x0) {
    puVar19 = iq3xs_init_impl::kgrid_512;
    if (grid_size == 0x100) {
      puVar19 = iq3xs_init_impl::kgrid_256;
    }
    local_40 = (size_t)grid_size;
    local_48 = (uint32_t *)malloc(local_40 * 4);
    uVar4 = 0;
    uVar12 = 0;
    puVar17 = local_48;
    if (0 < grid_size) {
      uVar12 = (ulong)(uint)grid_size;
    }
    for (; uVar4 != uVar12; uVar4 = uVar4 + 1) {
      uVar1 = puVar19[uVar4];
      puVar15 = puVar17;
      for (lVar10 = 0; lVar10 != 0xc; lVar10 = lVar10 + 3) {
        *(byte *)puVar15 = ((char)(uVar1 >> ((byte)lVar10 & 0x1f)) * '\x02' & 0xeU) + 1;
        puVar15 = (uint32_t *)((long)puVar15 + 1);
      }
      puVar17 = puVar17 + 1;
    }
    iq3_data[uVar2].grid = local_48;
    piVar5 = (int *)malloc(0x4000);
    iq3_data[uVar2].map = piVar5;
    for (lVar10 = 0; lVar10 != 0x1000; lVar10 = lVar10 + 1) {
      piVar5[lVar10] = -1;
    }
    for (uVar4 = 0; uVar4 != uVar12; uVar4 = uVar4 + 1) {
      aux32 = local_48[uVar4];
      uVar7 = 0;
      puVar17 = &aux32;
      for (lVar10 = 0; lVar10 != 0xc; lVar10 = lVar10 + 3) {
        uVar3 = (byte)*puVar17 - 1;
        uVar7 = (ulong)((uint)uVar7 |
                       CONCAT22((short)(uVar3 >> 0x10),
                                (short)((int)((uint)(ushort)((short)uVar3 >> 0xf) << 0x10 |
                                             uVar3 & 0xffff) / 2)) << ((byte)lVar10 & 0x1f));
        puVar17 = (uint32_t *)((long)puVar17 + 1);
      }
      piVar5[uVar7 & 0xffff] = (int)uVar4;
    }
    uVar3 = grid_size == 0x100 ^ 3;
    __ptr = (int *)malloc((long)(grid_size * 2) << 2);
    iVar18 = 0;
    iVar16 = 0;
    for (lVar10 = 0; lVar10 != 0x1000; lVar10 = lVar10 + 1) {
      if (piVar5[lVar10] < 0) {
        pcVar6 = pos;
        for (lVar11 = 0; lVar11 != 0xc; lVar11 = lVar11 + 3) {
          *pcVar6 = ((char)((uint)lVar10 >> ((byte)lVar11 & 0x1f)) * '\x02' & 0xeU) + 1;
          pcVar6 = pcVar6 + 1;
        }
        puVar17 = local_48;
        for (uVar4 = 0; uVar4 != uVar12; uVar4 = uVar4 + 1) {
          iVar13 = 0;
          for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
            iVar14 = (int)*(char *)((long)puVar17 + lVar11) - (int)pos[lVar11];
            iVar13 = iVar13 + iVar14 * iVar14;
          }
          __ptr[uVar4 * 2] = iVar13;
          __ptr[uVar4 * 2 + 1] = (int)uVar4;
          puVar17 = puVar17 + 1;
        }
        iVar16 = iVar16 + 1;
        qsort(__ptr,local_40,8,iq3_compare_func);
        iVar13 = *__ptr;
        uVar8 = 1;
        for (uVar4 = 0; uVar7 = uVar12, uVar12 != uVar4; uVar4 = uVar4 + 1) {
          if (iVar13 < __ptr[uVar4 * 2]) {
            uVar7 = uVar4;
            if (uVar8 == uVar3) break;
            uVar8 = uVar8 + 1;
            iVar13 = __ptr[uVar4 * 2];
          }
        }
        iVar18 = iVar18 + (int)uVar7;
      }
    }
    puVar19 = (uint16_t *)malloc((long)(iVar16 + iVar18) * 2);
    iq3_data[uVar2].neighbours = puVar19;
    local_38 = puVar19 + 1;
    uVar2 = 0;
    for (lVar10 = 0; lVar10 != 0x1000; lVar10 = lVar10 + 1) {
      if (piVar5[lVar10] < 0) {
        pcVar6 = pos;
        for (lVar11 = 0; lVar11 != 0xc; lVar11 = lVar11 + 3) {
          *pcVar6 = ((char)((uint)lVar10 >> ((byte)lVar11 & 0x1f)) * '\x02' & 0xeU) + 1;
          pcVar6 = pcVar6 + 1;
        }
        puVar17 = local_48;
        for (uVar4 = 0; uVar4 != uVar12; uVar4 = uVar4 + 1) {
          iVar16 = 0;
          for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
            iVar18 = (int)*(char *)((long)puVar17 + lVar11) - (int)pos[lVar11];
            iVar16 = iVar16 + iVar18 * iVar18;
          }
          __ptr[uVar4 * 2] = iVar16;
          __ptr[uVar4 * 2 + 1] = (int)uVar4;
          puVar17 = puVar17 + 1;
        }
        qsort(__ptr,local_40,8,iq3_compare_func);
        piVar5[lVar10] = ~uVar2;
        iVar16 = *__ptr;
        uVar9 = (int)uVar12 + 1 + uVar2;
        uVar8 = 1;
        for (uVar4 = 0; uVar7 = uVar12, uVar12 != uVar4; uVar4 = uVar4 + 1) {
          if (iVar16 < __ptr[uVar4 * 2]) {
            if (uVar8 == uVar3) {
              uVar9 = uVar2 + (int)uVar4 + 1;
              uVar7 = uVar4;
              break;
            }
            uVar8 = uVar8 + 1;
            iVar16 = __ptr[uVar4 * 2];
          }
          local_38[(long)(int)uVar2 + uVar4] = *(uint16_t *)(__ptr + uVar4 * 2 + 1);
        }
        puVar19[(int)uVar2] = (uint16_t)uVar7;
        uVar2 = uVar9;
      }
    }
    free(__ptr);
  }
  return;
}

Assistant:

void iq3xs_init_impl(int grid_size) {
    const int gindex = iq3_data_index(grid_size);
    if (iq3_data[gindex].grid) {
        return;
    }
    static const uint16_t kgrid_256[256] = {
            0,     2,     4,     9,    11,    15,    16,    18,    25,    34,    59,    61,    65,    67,    72,    74,
           81,    85,    88,    90,    97,   108,   120,   128,   130,   132,   137,   144,   146,   153,   155,   159,
          169,   175,   189,   193,   199,   200,   202,   213,   248,   267,   287,   292,   303,   315,   317,   321,
          327,   346,   362,   413,   436,   456,   460,   462,   483,   497,   513,   515,   520,   522,   529,   531,
          536,   538,   540,   551,   552,   576,   578,   585,   592,   594,   641,   643,   648,   650,   657,   664,
          698,   704,   706,   720,   729,   742,   758,   769,   773,   808,   848,   852,   870,   889,   901,   978,
          992,  1024,  1026,  1033,  1035,  1040,  1042,  1046,  1049,  1058,  1089,  1091,  1093,  1096,  1098,  1105,
         1112,  1139,  1143,  1144,  1152,  1154,  1161,  1167,  1168,  1170,  1183,  1184,  1197,  1217,  1224,  1228,
         1272,  1276,  1309,  1323,  1347,  1367,  1377,  1404,  1473,  1475,  1486,  1509,  1537,  1544,  1546,  1553,
         1555,  1576,  1589,  1594,  1600,  1602,  1616,  1625,  1636,  1638,  1665,  1667,  1672,  1685,  1706,  1722,
         1737,  1755,  1816,  1831,  1850,  1856,  1862,  1874,  1901,  1932,  1950,  1971,  2011,  2032,  2052,  2063,
         2077,  2079,  2091,  2095,  2172,  2192,  2207,  2208,  2224,  2230,  2247,  2277,  2308,  2345,  2356,  2389,
         2403,  2424,  2501,  2504,  2506,  2520,  2570,  2593,  2616,  2624,  2630,  2646,  2669,  2700,  2714,  2746,
         2754,  2795,  2824,  2835,  2839,  2874,  2882,  2905,  2984,  3028,  3042,  3092,  3108,  3110,  3124,  3153,
         3185,  3215,  3252,  3288,  3294,  3364,  3397,  3434,  3483,  3523,  3537,  3587,  3589,  3591,  3592,  3610,
         3626,  3670,  3680,  3722,  3749,  3754,  3776,  3789,  3803,  3824,  3857,  3873,  3904,  3906,  3924,  3992,
    };
    static const uint16_t kgrid_512[512] = {
            0,     1,     2,     5,     7,     8,     9,    10,    12,    14,    16,    17,    21,    27,    32,    34,
           37,    39,    41,    43,    48,    50,    57,    60,    63,    64,    65,    66,    68,    72,    73,    77,
           80,    83,    87,    89,    93,   100,   113,   117,   122,   128,   129,   133,   135,   136,   139,   142,
          145,   149,   152,   156,   162,   165,   167,   169,   171,   184,   187,   195,   201,   205,   208,   210,
          217,   219,   222,   228,   232,   234,   247,   249,   253,   256,   267,   271,   273,   276,   282,   288,
          291,   297,   312,   322,   324,   336,   338,   342,   347,   353,   357,   359,   374,   379,   390,   393,
          395,   409,   426,   441,   448,   450,   452,   464,   466,   470,   475,   488,   492,   512,   513,   514,
          516,   520,   521,   523,   525,   527,   528,   530,   537,   540,   542,   556,   558,   561,   570,   576,
          577,   579,   582,   584,   588,   593,   600,   603,   609,   616,   618,   632,   638,   640,   650,   653,
          655,   656,   660,   666,   672,   675,   685,   688,   698,   705,   708,   711,   712,   715,   721,   727,
          728,   732,   737,   754,   760,   771,   773,   778,   780,   793,   795,   802,   806,   808,   812,   833,
          840,   843,   849,   856,   858,   873,   912,   916,   919,   932,   934,   961,   963,   968,   970,   977,
          989,   993,  1010,  1016,  1024,  1025,  1027,  1029,  1031,  1032,  1034,  1036,  1038,  1041,  1043,  1047,
         1048,  1050,  1057,  1059,  1061,  1064,  1066,  1079,  1080,  1083,  1085,  1088,  1090,  1096,  1099,  1103,
         1106,  1109,  1113,  1116,  1122,  1129,  1153,  1156,  1159,  1169,  1171,  1176,  1183,  1185,  1195,  1199,
         1209,  1212,  1216,  1218,  1221,  1225,  1234,  1236,  1241,  1243,  1250,  1256,  1270,  1281,  1287,  1296,
         1299,  1306,  1309,  1313,  1338,  1341,  1348,  1353,  1362,  1375,  1376,  1387,  1400,  1408,  1410,  1415,
         1425,  1453,  1457,  1477,  1481,  1494,  1496,  1507,  1512,  1538,  1545,  1547,  1549,  1551,  1554,  1561,
         1563,  1565,  1570,  1572,  1575,  1577,  1587,  1593,  1601,  1603,  1605,  1612,  1617,  1619,  1632,  1648,
         1658,  1662,  1664,  1674,  1680,  1690,  1692,  1704,  1729,  1736,  1740,  1745,  1747,  1751,  1752,  1761,
         1763,  1767,  1773,  1787,  1795,  1801,  1806,  1810,  1817,  1834,  1840,  1844,  1857,  1864,  1866,  1877,
         1882,  1892,  1902,  1915,  1934,  1953,  1985,  1987,  2000,  2002,  2013,  2048,  2052,  2058,  2064,  2068,
         2071,  2074,  2081,  2088,  2104,  2114,  2119,  2121,  2123,  2130,  2136,  2141,  2147,  2153,  2157,  2177,
         2179,  2184,  2189,  2193,  2203,  2208,  2223,  2226,  2232,  2244,  2249,  2251,  2256,  2258,  2265,  2269,
         2304,  2306,  2324,  2335,  2336,  2361,  2373,  2375,  2385,  2418,  2443,  2460,  2480,  2504,  2509,  2520,
         2531,  2537,  2562,  2568,  2572,  2578,  2592,  2596,  2599,  2602,  2614,  2620,  2625,  2627,  2629,  2634,
         2641,  2650,  2682,  2688,  2697,  2707,  2712,  2718,  2731,  2754,  2759,  2760,  2775,  2788,  2793,  2805,
         2811,  2817,  2820,  2832,  2842,  2854,  2890,  2902,  2921,  2923,  2978,  3010,  3012,  3026,  3081,  3083,
         3085,  3097,  3099,  3120,  3136,  3152,  3159,  3188,  3210,  3228,  3234,  3245,  3250,  3256,  3264,  3276,
         3281,  3296,  3349,  3363,  3378,  3392,  3395,  3420,  3440,  3461,  3488,  3529,  3531,  3584,  3588,  3591,
         3600,  3602,  3614,  3616,  3628,  3634,  3650,  3657,  3668,  3683,  3685,  3713,  3716,  3720,  3726,  3729,
         3736,  3753,  3778,  3802,  3805,  3819,  3841,  3845,  3851,  3856,  3880,  3922,  3938,  3970,  3993,  4032,
    };

    const int kmap_size = 4096;
    const int nwant = grid_size == 256 ? 2 : 3;
    const uint16_t * kgrid = grid_size == 256 ? kgrid_256 : kgrid_512;
    uint32_t * kgrid_q3xs;
    int      * kmap_q3xs;
    uint16_t * kneighbors_q3xs;

    //printf("================================================================= %s(grid_size = %d)\n", __func__, grid_size);
    uint32_t * the_grid = (uint32_t *)malloc(grid_size*sizeof(uint32_t));
    for (int k = 0; k < grid_size; ++k) {
        int8_t * pos = (int8_t *)(the_grid + k);
        for (int i = 0; i < 4; ++i) {
            int l = (kgrid[k] >> 3*i) & 0x7;
            pos[i] = 2*l + 1;
        }
    }
    kgrid_q3xs = the_grid;
    iq3_data[gindex].grid = the_grid;
    kmap_q3xs = (int *)malloc(kmap_size*sizeof(int));
    iq3_data[gindex].map = kmap_q3xs;
    for (int i = 0; i < kmap_size; ++i) kmap_q3xs[i] = -1;
    uint32_t aux32;
    uint8_t * aux8 = (uint8_t *)&aux32;
    for (int i = 0; i < grid_size; ++i) {
        aux32 = kgrid_q3xs[i];
        uint16_t index = 0;
        for (int k=0; k<4; ++k) {
            uint16_t q = (aux8[k] - 1)/2;
            index |= (q << 3*k);
        }
        kmap_q3xs[index] = i;
    }
    int8_t pos[4];
    int * dist2 = (int *)malloc(2*grid_size*sizeof(int));
    int num_neighbors = 0, num_not_in_map = 0;
    for (int i = 0; i < kmap_size; ++i) {
        if (kmap_q3xs[i] >= 0) continue;
        ++num_not_in_map;
        for (int k = 0; k < 4; ++k) {
            int l = (i >> 3*k) & 0x7;
            pos[k] = 2*l + 1;
        }
        for (int j = 0; j < grid_size; ++j) {
            const int8_t * pg = (const int8_t *)(kgrid_q3xs + j);
            int d2 = 0;
            for (int k = 0; k < 4; ++k) d2 += (pg[k] - pos[k])*(pg[k] - pos[k]);
            dist2[2*j+0] = d2;
            dist2[2*j+1] = j;
        }
        qsort(dist2, grid_size, 2*sizeof(int), iq3_compare_func);
        int n = 0; int d2 = dist2[0];
        int nhave = 1;
        for (int j = 0; j < grid_size; ++j) {
            if (dist2[2*j] > d2) {
                if (nhave == nwant) break;
                d2 = dist2[2*j];
                ++nhave;
            }
            ++n;
        }
        num_neighbors += n;
    }
    //printf("%s: %d neighbours in total\n", __func__, num_neighbors);
    kneighbors_q3xs = (uint16_t *)malloc((num_neighbors + num_not_in_map)*sizeof(uint16_t));
    iq3_data[gindex].neighbours = kneighbors_q3xs;
    int counter = 0;
    for (int i = 0; i < kmap_size; ++i) {
        if (kmap_q3xs[i] >= 0) continue;
        for (int k = 0; k < 4; ++k) {
            int l = (i >> 3*k) & 0x7;
            pos[k] = 2*l + 1;
        }
        for (int j = 0; j < grid_size; ++j) {
            const int8_t * pg = (const int8_t *)(kgrid_q3xs + j);
            int d2 = 0;
            for (int k = 0; k < 4; ++k) d2 += (pg[k] - pos[k])*(pg[k] - pos[k]);
            dist2[2*j+0] = d2;
            dist2[2*j+1] = j;
        }
        qsort(dist2, grid_size, 2*sizeof(int), iq3_compare_func);
        kmap_q3xs[i] = -(counter + 1);
        int d2 = dist2[0];
        uint16_t * start = &kneighbors_q3xs[counter++];
        int n = 0, nhave = 1;
        for (int j = 0; j < grid_size; ++j) {
            if (dist2[2*j] > d2) {
                if (nhave == nwant) break;
                d2 = dist2[2*j];
                ++nhave;
            }
            kneighbors_q3xs[counter++] = dist2[2*j+1];
            ++n;
        }
        *start = n;
    }
    free(dist2);
}